

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O1

int tokthfind1(void *ctx0,toksdef *sym,mcmon objn)

{
  int iVar1;
  tokseadef *ctx;
  
  iVar1 = 0;
  if ((sym->toksval == *(ushort *)((long)ctx0 + 10)) && (sym->tokstyp == *(uchar *)((long)ctx0 + 8))
     ) {
    memcpy(*(void **)((long)ctx0 + 0x38),sym,(ulong)sym->tokslen + 8);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int tokthfind1(void *ctx0, toksdef *sym, mcmon objn)
{
    tokseadef *ctx = (tokseadef *)ctx0;
    
    VARUSED(objn);
    
    if (sym->toksval == ctx->tokseasym.toksval
        && sym->tokstyp == ctx->tokseasym.tokstyp)
    {
        memcpy(ctx->toksearet, sym,
               (size_t)(sizeof(toks1def) + sym->tokslen));
        return(TRUE);
    }
    else
        return(FALSE);
}